

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  int iVar2;
  ImGuiInputEvent *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  long lVar7;
  ImGuiKeyData *pIVar8;
  ImGuiInputEvent *__dest;
  int iVar9;
  anon_union_12_7_50fd3ec1_for_ImGuiInputEvent_2 *paVar10;
  int iVar11;
  
  pIVar6 = GImGui;
  if (key == 0) {
    return;
  }
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x518,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
  }
  if (0x84 < key - 0x200U) {
    __assert_fail("ImGui::IsNamedKey(key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x519,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
  }
  if (this->BackendUsingLegacyKeyArrays != '\0') {
    if (this->BackendUsingLegacyKeyArrays != -1) {
      __assert_fail("(BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x51d,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    lVar7 = 0;
    do {
      if (this->KeyMap[lVar7 + 0x200] != -1) {
        __assert_fail("KeyMap[n] == -1 && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x520,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x85);
  }
  this->BackendUsingLegacyKeyArrays = '\0';
  if (key - 0x269U < 0x18) {
    this->BackendUsingLegacyNavInputArray = false;
  }
  pIVar8 = ImGui::GetKeyData(key);
  if (pIVar8->Down == down) {
    if ((pIVar8->AnalogValue == analog_value) && (!NAN(pIVar8->AnalogValue) && !NAN(analog_value)))
    {
      lVar7 = (long)(pIVar6->InputEventsQueue).Size;
      if (lVar7 < 1) {
        return;
      }
      paVar10 = &(pIVar6->InputEventsQueue).Data[lVar7 + -1].field_2;
      bVar5 = false;
      bVar4 = false;
      do {
        if ((((ImGuiInputEvent *)((long)paVar10 + -8))->Type == ImGuiInputEventType_Key) &&
           (bVar4 = bVar5, (paVar10->MouseButton).Button == key)) {
          bVar5 = true;
          bVar4 = true;
        }
        if (lVar7 < 2) break;
        paVar10 = paVar10 + -2;
        lVar7 = lVar7 + -1;
      } while (!bVar4);
      if (!bVar4) {
        return;
      }
    }
  }
  iVar11 = (pIVar6->InputEventsQueue).Size;
  iVar2 = (pIVar6->InputEventsQueue).Capacity;
  if (iVar11 == iVar2) {
    iVar11 = iVar11 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar2 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData)
      ;
      pIVar3 = (pIVar6->InputEventsQueue).Data;
      if (pIVar3 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar6->InputEventsQueue).Size * 0x18);
        pIVar3 = (pIVar6->InputEventsQueue).Data;
        if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar6->InputEventsQueue).Data = __dest;
      (pIVar6->InputEventsQueue).Capacity = iVar11;
    }
  }
  pIVar3 = (pIVar6->InputEventsQueue).Data;
  iVar11 = (pIVar6->InputEventsQueue).Size;
  pIVar3[iVar11].Type = ImGuiInputEventType_Key;
  pIVar3[iVar11].Source = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
  pIVar3[iVar11].field_2.Key.Key = key;
  pIVar3[iVar11].field_2.MouseButton.Down = down;
  *(undefined2 *)((long)&pIVar3[iVar11].field_2 + 5) = 0;
  *(undefined1 *)((long)&pIVar3[iVar11].field_2 + 7) = 0;
  pIVar3[iVar11].field_2.Key.AnalogValue = analog_value;
  *(undefined4 *)&pIVar3[iVar11].AddedByTestEngine = 0;
  (pIVar6->InputEventsQueue).Size = (pIVar6->InputEventsQueue).Size + 1;
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}